

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

Error asmjit::Logging::formatInstruction
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Detail *detail,Operand_ *opArray,uint32_t opCount)

{
  uint uVar1;
  uint uVar2;
  Error EVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t advance;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  undefined1 *puVar10;
  uint uVar11;
  Operand_ *op;
  uint uVar12;
  uint32_t count;
  uint32_t uVar13;
  char cStack_68;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_40;
  
  uVar1 = detail->options;
  uVar2 = detail->instId;
  uVar5 = (ulong)uVar2;
  if (uVar5 < 0x59c) {
    if (((uVar1 & 0x40) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"short ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    cStack_68 = (char)uVar1;
    if ((cStack_68 < '\0') &&
       (EVar3 = StringBuilder::_opString(sb,1,"long ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xacquire ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0x11 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xrelease ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xd & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"lock ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if ((uVar1 & 0xc000) != 0) {
      pcVar9 = "rep ";
      if ((uVar1 >> 0xe & 1) == 0) {
        pcVar9 = "repnz ";
      }
      StringBuilder::_opString(sb,1,pcVar9,0xffffffffffffffff);
      if ((detail->extraReg)._signature != 0) {
        EVar3 = StringBuilder::_opChar(sb,1,'{');
        if (EVar3 != 0) {
          return EVar3;
        }
        aStack_40._packed[0] = (UInt64)detail->extraReg;
        aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        EVar3 = X86Logging::formatOperand
                          (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = StringBuilder::_opString(sb,1,"} ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0x1e000000) == 0) {
        EVar3 = StringBuilder::_opString(sb,1,"rex ",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      else {
        StringBuilder::_opString(sb,1,"rex.",0xffffffffffffffff);
        if ((uVar1 >> 0x1b & 1) != 0) {
          StringBuilder::_opChar(sb,1,'r');
        }
        if ((uVar1 >> 0x1a & 1) != 0) {
          StringBuilder::_opChar(sb,1,'x');
        }
        if ((uVar1 >> 0x19 & 1) != 0) {
          StringBuilder::_opChar(sb,1,'b');
        }
        if ((uVar1 >> 0x1c & 1) != 0) {
          StringBuilder::_opChar(sb,1,'w');
        }
        StringBuilder::_opChar(sb,1,' ');
      }
    }
    if (((uVar1 >> 10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"vex3 ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    if (((uVar1 >> 0xc & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"evex ",0xffffffffffffffff), EVar3 != 0)) {
      return EVar3;
    }
    EVar3 = StringBuilder::_opString
                      (sb,1,&X86InstDB::nameData +
                            (*(uint *)(X86InstDB::instData + uVar5 * 0xc) >> 8 & 0x3fff),
                       0xffffffffffffffff);
  }
  else {
    EVar3 = StringBuilder::appendFormat(sb,"<unknown id=#%u>",uVar5);
  }
  if (EVar3 == 0) {
    uVar8 = 0;
    while ((uVar8 != opCount &&
           ((undefined1  [16])((undefined1  [16])opArray[uVar8].field_0 & (undefined1  [16])0x7) !=
            (undefined1  [16])0x0))) {
      pcVar9 = ", ";
      if (uVar8 == 0) {
        pcVar9 = " ";
      }
      EVar3 = StringBuilder::_opString(sb,1,pcVar9,0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      op = opArray + uVar8;
      EVar3 = X86Logging::formatOperand(sb,logOptions,emitter,archType,op);
      if (EVar3 != 0) {
        return EVar3;
      }
      if (((logOptions & 2) == 0) || (((op->field_0)._any.signature & 7) != 3))
      goto switchD_0015c047_caseD_54b;
      uVar5 = 0x10;
      for (lVar4 = 0; uVar12 = (uint)uVar5, (ulong)opCount << 4 != lVar4; lVar4 = lVar4 + 0x10) {
        uVar11 = *(uint *)((long)&opArray->field_0 + lVar4);
        uVar6 = uVar11 >> 0x18;
        uVar7 = (ulong)uVar6;
        if (uVar6 < uVar12) {
          uVar7 = uVar5;
        }
        if ((uVar11 & 7) == 1) {
          uVar5 = uVar7;
        }
      }
      uVar11 = (uint)*(byte *)((long)&op->field_0 + 8);
      switch(uVar2) {
      case 0x41e:
        uVar6 = uVar12 >> 2;
        if (7 < uVar12 >> 2) {
          uVar6 = 8;
        }
        break;
      case 0x41f:
      case 0x421:
      case 0x422:
      case 0x423:
      case 0x424:
      case 0x425:
      case 0x426:
      case 0x428:
      case 0x42b:
      case 0x42c:
      case 0x42d:
      case 0x42e:
      case 0x42f:
      case 0x430:
      case 0x431:
      case 0x432:
      case 0x433:
      case 0x434:
      case 0x435:
      case 0x436:
      case 0x43f:
      case 0x440:
      case 0x447:
      case 0x448:
      case 1099:
      case 0x44c:
      case 0x44d:
      case 0x44e:
      case 0x44f:
      case 0x450:
      case 0x451:
      case 0x452:
      case 0x453:
      case 0x454:
      case 0x458:
        goto switchD_0015c047_caseD_54b;
      case 0x420:
        goto switchD_0015c025_caseD_420;
      case 0x427:
switchD_0015c025_caseD_427:
        puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vpclmulqdq;
        goto LAB_0015c1b6;
      case 0x429:
      case 0x42a:
      case 0x437:
      case 0x438:
      case 0x439:
      case 0x43a:
      case 0x43b:
      case 0x43c:
        puVar10 = "eq";
        goto LAB_0015c0ab;
      case 0x43d:
      case 0x43e:
      case 0x441:
      case 0x442:
      case 0x443:
      case 0x444:
      case 0x445:
      case 0x446:
        puVar10 = "lt";
LAB_0015c0ab:
        advance = 4;
        uVar13 = 2;
        count = advance;
LAB_0015c1a5:
        EVar3 = X86Logging_formatImmText(sb,uVar11,uVar13,advance,puVar10,count);
        goto LAB_0015c20f;
      case 0x449:
      case 0x44a:
        puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vperm2x128;
LAB_0015c1b6:
        uVar13 = 2;
LAB_0015c20a:
        EVar3 = X86Logging_formatImmBits(sb,uVar11,(ImmBits *)puVar10,uVar13);
        goto LAB_0015c20f;
      case 0x455:
switchD_0015c025_caseD_455:
        uVar6 = uVar12 >> 3;
        break;
      case 0x456:
      case 0x457:
      case 0x459:
        goto switchD_0015c025_caseD_456;
      default:
        switch(uVar2) {
        case 0x53f:
        case 0x540:
        case 0x541:
        case 0x542:
        case 0x543:
        case 0x544:
        case 0x545:
        case 0x546:
          puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vreducexx_vrndscalexx;
LAB_0015c115:
          uVar13 = 3;
          goto LAB_0015c20a;
        case 0x547:
        case 0x548:
        case 0x549:
        case 0x54a:
switchD_0015c047_caseD_547:
          puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vroundxx;
          goto LAB_0015c1b6;
        case 0x54b:
        case 0x54c:
        case 0x54d:
        case 0x54e:
        case 0x54f:
        case 0x550:
        case 0x551:
        case 0x552:
        case 0x553:
        case 0x554:
        case 0x555:
        case 0x556:
        case 0x557:
        case 0x558:
        case 0x559:
        case 0x55a:
        case 0x55b:
        case 0x55c:
        case 0x55d:
        case 0x55e:
        case 0x55f:
        case 0x560:
        case 0x561:
        case 0x562:
        case 0x563:
        case 0x564:
          goto switchD_0015c047_caseD_54b;
        case 0x565:
        case 0x566:
        case 0x567:
        case 0x568:
          uVar6 = (uint)(uVar5 >> 4);
          if (uVar6 < 3) {
            uVar6 = 2;
          }
          uVar13 = 2 - (uVar12 < 0x30);
          goto LAB_0015c1f6;
        case 0x569:
switchD_0015c047_caseD_569:
          count = uVar12 >> 3;
          if (7 < count) {
            count = 8;
          }
          uVar13 = 1;
          advance = 2;
          puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufpd;
          break;
        case 0x56a:
switchD_0015c047_caseD_56a:
          puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufps;
          goto LAB_0015c0ab;
        default:
          uVar5 = (ulong)(uVar2 - 0x4fa);
          if (uVar2 - 0x4fa < 0x3b) {
            if ((0x780000000000000U >> (uVar5 & 0x3f) & 1) != 0) {
              puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vrangexx;
              goto LAB_0015c1b6;
            }
            if ((3UL >> (uVar5 & 0x3f) & 1) != 0) goto switchD_0015c025_caseD_456;
            if ((0x600000000U >> (uVar5 & 0x3f) & 1) != 0) goto switchD_0015c025_caseD_420;
          }
          uVar6 = uVar2 - 0x68;
          if (uVar6 < 0x2f) {
            if ((0x1bUL >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
              if ((0x600000000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0)
              goto switchD_0015c025_caseD_420;
              goto LAB_0015bf16;
            }
            uVar13 = 3;
          }
          else {
LAB_0015bf16:
            if (uVar2 - 0x27a < 4) goto switchD_0015c047_caseD_547;
            if (3 < uVar2 - 0x307) {
              if (uVar2 - 0x3a5 < 4) {
                puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                           ::vfpclassxx;
LAB_0015c207:
                uVar13 = 1;
                goto LAB_0015c20a;
              }
              if (uVar2 - 0x3bd < 4) {
                puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                           ::vgetmantxx;
                goto LAB_0015c115;
              }
              if (uVar2 - 0x241 < 3) {
switchD_0015c025_caseD_456:
                uVar13 = 2;
                uVar6 = 4;
              }
              else {
                if (1 < uVar2 - 0x33e) {
                  if (uVar2 == 0x22) goto switchD_0015c025_caseD_455;
                  if (uVar2 == 0x23) {
LAB_0015c1d8:
                    uVar6 = uVar12 >> 2;
                    goto LAB_0015c1ed;
                  }
                  if (uVar2 == 0x1ae) {
LAB_0015c1ba:
                    uVar13 = uVar12 >> 3;
                    if (3 < uVar13) {
                      uVar13 = 4;
                    }
                    puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                              ::vmpsadbw;
                    goto LAB_0015c20a;
                  }
                  if (uVar2 != 0x1d5) {
                    if (uVar2 == 0x1d6) goto switchD_0015c025_caseD_427;
                    if (uVar2 != 0x240) {
                      if (uVar2 == 0x2b4) goto switchD_0015c047_caseD_569;
                      if (uVar2 == 0x2b5) goto switchD_0015c047_caseD_56a;
                      if (uVar2 != 0x4f9) {
                        if (uVar2 == 0x2f6) goto LAB_0015c1d8;
                        if (uVar2 == 0x319) {
                          puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                                     ::vroundxx;
                          goto LAB_0015c207;
                        }
                        if (uVar2 != 0x339) {
                          if (uVar2 != 0x3fc) {
                            if (uVar2 != 0x2f5) goto switchD_0015c047_caseD_54b;
                            goto switchD_0015c025_caseD_455;
                          }
                          goto LAB_0015c1ba;
                        }
                      }
                    }
                    goto switchD_0015c025_caseD_456;
                  }
                }
switchD_0015c025_caseD_420:
                uVar13 = 1;
                uVar6 = 8;
              }
              goto LAB_0015c1f6;
            }
            uVar13 = 5;
          }
          advance = 0;
          puVar10 = "eq_oq";
          count = 1;
        }
        goto LAB_0015c1a5;
      }
LAB_0015c1ed:
      uVar13 = 1;
LAB_0015c1f6:
      EVar3 = X86Logging_formatImmShuf(sb,uVar11,uVar13,uVar6);
LAB_0015c20f:
      if (EVar3 != 0) {
        return EVar3;
      }
switchD_0015c047_caseD_54b:
      if (uVar8 == 0) {
        if (((detail->extraReg)._signature & 0xf00) == 0x300) {
          EVar3 = StringBuilder::_opString(sb,1," {",0xffffffffffffffff);
          if (EVar3 != 0) {
            return EVar3;
          }
          aStack_40._packed[0] = (UInt64)detail->extraReg;
          aStack_40._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
          EVar3 = X86Logging::formatOperand
                            (sb,logOptions,emitter,archType,(Operand_ *)&aStack_40._any);
          if (EVar3 != 0) {
            return EVar3;
          }
          EVar3 = StringBuilder::_opChar(sb,1,'}');
          if (EVar3 != 0) {
            return EVar3;
          }
          if ((uVar1 >> 0x17 & 1) != 0) {
            pcVar9 = "{z}";
LAB_0015c2d4:
            EVar3 = StringBuilder::_opString(sb,1,pcVar9,0xffffffffffffffff);
            if (EVar3 != 0) {
              return EVar3;
            }
          }
        }
        else if ((uVar1 >> 0x17 & 1) != 0) {
          pcVar9 = " {z}";
          goto LAB_0015c2d4;
        }
      }
      if ((((op->field_0)._any.signature & 7) == 2 && (uVar1 >> 0x14 & 1) != 0) &&
         (EVar3 = StringBuilder::_opString(sb,1," {1tox}",0xffffffffffffffff), EVar3 != 0)) {
        return EVar3;
      }
      uVar8 = uVar8 + 1;
    }
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

Error Logging::formatInstruction(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Inst::Detail& detail, const Operand_* opArray, uint32_t opCount) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatInstruction(sb, logOptions, emitter, archType, detail, opArray, opCount);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}